

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

QSize __thiscall QSidebar::sizeHint(QSidebar *this)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  QSize *this_00;
  QSize QVar3;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  QModelIndex *index;
  QAbstractItemView *in_stack_ffffffffffffffb0;
  QAbstractScrollArea *in_stack_ffffffffffffffb8;
  undefined1 local_40 [24];
  undefined1 local_28 [24];
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  index = in_RDI;
  pQVar2 = QAbstractItemView::model((QAbstractItemView *)in_RDI);
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    QVar3 = QAbstractScrollArea::sizeHint(in_stack_ffffffffffffffb8);
  }
  else {
    this_00 = (QSize *)QAbstractItemView::model((QAbstractItemView *)in_RDI);
    QModelIndex::QModelIndex((QModelIndex *)0x786ecd);
    (**(code **)((long)*this_00 + 0x60))(local_28,this_00,0,0,local_40);
    local_10 = QAbstractItemView::sizeHintForIndex(in_stack_ffffffffffffffb0,index);
    iVar1 = QFrame::frameWidth((QFrame *)this_00);
    iVar1 = iVar1 << 1;
    QFrame::frameWidth((QFrame *)this_00);
    QSize::QSize(this_00,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                 (int)in_stack_ffffffffffffff88);
    QVar3 = ::operator+((QSize *)in_RDI,(QSize *)CONCAT44(iVar1,in_stack_ffffffffffffff98));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize QSidebar::sizeHint() const
{
    if (model())
        return QListView::sizeHintForIndex(model()->index(0, 0)) + QSize(2 * frameWidth(), 2 * frameWidth());
    return QListView::sizeHint();
}